

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memjrnlRead(sqlite3_file *pJfd,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  int iVar1;
  bool bVar2;
  sqlite3_io_methods *local_78;
  int local_68;
  int nCopy;
  int iSpace;
  sqlite3_int64 iOff;
  FileChunk *pChunk;
  int iChunkOffset;
  int nRead;
  u8 *zOut;
  MemJournal *p;
  sqlite_int64 iOfst_local;
  int iAmt_local;
  void *zBuf_local;
  sqlite3_file *pJfd_local;
  
  if ((long)pJfd[3].pMethods < iAmt + iOfst) {
    pJfd_local._4_4_ = 0x20a;
  }
  else {
    if ((pJfd[5].pMethods == (sqlite3_io_methods *)iOfst) && (iOfst != 0)) {
      iOff = (sqlite3_int64)pJfd[6].pMethods;
    }
    else {
      _nCopy = 0;
      iOff = (sqlite3_int64)pJfd[2].pMethods;
      while( true ) {
        bVar2 = false;
        if (iOff != 0) {
          bVar2 = _nCopy + *(int *)&pJfd[1].pMethods <= iOfst;
        }
        if (!bVar2) break;
        _nCopy = *(int *)&pJfd[1].pMethods + _nCopy;
        iOff = *(sqlite3_int64 *)iOff;
      }
    }
    pChunk._0_4_ = (int)(iOfst % (long)*(int *)&pJfd[1].pMethods);
    pChunk._4_4_ = iAmt;
    _iChunkOffset = zBuf;
    do {
      iVar1 = *(int *)&pJfd[1].pMethods;
      if (pChunk._4_4_ < *(int *)&pJfd[1].pMethods - (int)pChunk) {
        local_68 = pChunk._4_4_;
      }
      else {
        local_68 = *(int *)&pJfd[1].pMethods - (int)pChunk;
      }
      memcpy(_iChunkOffset,(void *)(iOff + 8 + (long)(int)pChunk),(long)local_68);
      _iChunkOffset = (void *)((long)_iChunkOffset + (long)local_68);
      pChunk._4_4_ = pChunk._4_4_ - (iVar1 - (int)pChunk);
      pChunk._0_4_ = 0;
      bVar2 = false;
      if (-1 < pChunk._4_4_) {
        iOff = *(sqlite3_int64 *)iOff;
        bVar2 = false;
        if (iOff != 0) {
          bVar2 = 0 < pChunk._4_4_;
        }
      }
    } while (bVar2);
    if (iOff == 0) {
      local_78 = (sqlite3_io_methods *)0x0;
    }
    else {
      local_78 = (sqlite3_io_methods *)(iOfst + iAmt);
    }
    pJfd[5].pMethods = local_78;
    pJfd[6].pMethods = (sqlite3_io_methods *)iOff;
    pJfd_local._4_4_ = 0;
  }
  return pJfd_local._4_4_;
}

Assistant:

static int memjrnlRead(
  sqlite3_file *pJfd,    /* The journal file from which to read */
  void *zBuf,            /* Put the results here */
  int iAmt,              /* Number of bytes to read */
  sqlite_int64 iOfst     /* Begin reading at this offset */
){
  MemJournal *p = (MemJournal *)pJfd;
  u8 *zOut = zBuf;
  int nRead = iAmt;
  int iChunkOffset;
  FileChunk *pChunk;

  if( (iAmt+iOfst)>p->endpoint.iOffset ){
    return SQLITE_IOERR_SHORT_READ;
  }
  assert( p->readpoint.iOffset==0 || p->readpoint.pChunk!=0 );
  if( p->readpoint.iOffset!=iOfst || iOfst==0 ){
    sqlite3_int64 iOff = 0;
    for(pChunk=p->pFirst;
        ALWAYS(pChunk) && (iOff+p->nChunkSize)<=iOfst;
        pChunk=pChunk->pNext
    ){
      iOff += p->nChunkSize;
    }
  }else{
    pChunk = p->readpoint.pChunk;
    assert( pChunk!=0 );
  }

  iChunkOffset = (int)(iOfst%p->nChunkSize);
  do {
    int iSpace = p->nChunkSize - iChunkOffset;
    int nCopy = MIN(nRead, (p->nChunkSize - iChunkOffset));
    memcpy(zOut, (u8*)pChunk->zChunk + iChunkOffset, nCopy);
    zOut += nCopy;
    nRead -= iSpace;
    iChunkOffset = 0;
  } while( nRead>=0 && (pChunk=pChunk->pNext)!=0 && nRead>0 );
  p->readpoint.iOffset = pChunk ? iOfst+iAmt : 0;
  p->readpoint.pChunk = pChunk;

  return SQLITE_OK;
}